

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O3

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  _Alloc_hider _Var9;
  string buildname;
  string RegExp;
  string compiler;
  string local_1c0;
  undefined1 *local_1a0;
  long local_198;
  undefined1 local_190;
  undefined7 uStack_18f;
  ulong *local_180;
  long local_178;
  ulong local_170;
  undefined4 uStack_168;
  undefined4 uStack_164;
  string local_160;
  undefined1 *local_140;
  undefined8 local_138;
  undefined1 local_130;
  undefined7 uStack_12f;
  long *local_120;
  undefined8 local_118;
  long local_110;
  undefined8 uStack_108;
  undefined1 local_100 [88];
  char *local_a8;
  char *local_a0;
  char *local_48;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_100);
    _Var9._M_p = (pointer)local_100._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) goto LAB_0033c61b;
  }
  else {
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
    if (pcVar3 != (char *)0x0) {
      local_48 = (char *)0x0;
      cmsys::RegularExpression::compile((RegularExpression *)local_100,"[()/]");
      bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_100,pcVar3);
      if (bVar2) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        sVar4 = strlen(pcVar3);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,pcVar3,pcVar3 + sVar4);
        if ((char *)local_1c0._M_string_length != (char *)0x0) {
          pcVar3 = (char *)0x0;
          do {
            if (local_1c0._M_dataplus._M_p[(long)pcVar3] == '/') {
              local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
            }
            pcVar3 = pcVar3 + 1;
          } while ((char *)local_1c0._M_string_length != pcVar3);
          if ((char *)local_1c0._M_string_length != (char *)0x0) {
            pcVar3 = (char *)0x0;
            do {
              if (local_1c0._M_dataplus._M_p[(long)pcVar3] == '(') {
                local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
              }
              pcVar3 = pcVar3 + 1;
            } while ((char *)local_1c0._M_string_length != pcVar3);
            if ((char *)local_1c0._M_string_length != (char *)0x0) {
              pcVar3 = (char *)0x0;
              do {
                if (local_1c0._M_dataplus._M_p[(long)pcVar3] == ')') {
                  local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
                }
                pcVar3 = pcVar3 + 1;
              } while ((char *)local_1c0._M_string_length != pcVar3);
            }
          }
        }
        cmMakefile::AddCacheDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
                   "Name of build.",STRING,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,
                          (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
        }
      }
      if (local_48 != (char *)0x0) {
        operator_delete__(local_48);
      }
      goto LAB_0033c61b;
    }
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"WinNT","");
    this_00 = (this->super_cmCommand).Makefile;
    local_100._0_8_ = local_100 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"UNIX","");
    pcVar3 = cmMakefile::GetDefinition(this_00,(string *)local_100);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1c0,0,(char *)local_1c0._M_string_length,0x5ebb3a);
      cmSystemTools::RunSingleCommand
                ("uname -a",&local_1c0,&local_1c0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,0.0);
      if ((char *)local_1c0._M_string_length != (char *)0x0) {
        local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"([^ ]*) [^ ]* ([^ ]*) ","");
        local_48 = (char *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          cmsys::RegularExpression::compile
                    ((RegularExpression *)local_100,local_160._M_dataplus._M_p);
        }
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_100,local_1c0._M_dataplus._M_p);
        if (bVar2) {
          local_140 = &local_130;
          if ((char *)local_100._8_8_ == (char *)0x0) {
            local_138 = 0;
            local_130 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_140,local_100._8_8_,local_a8);
          }
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
          local_180 = &local_170;
          puVar7 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar7) {
            local_170 = *puVar7;
            uStack_168 = (undefined4)plVar5[3];
            uStack_164 = *(undefined4 *)((long)plVar5 + 0x1c);
          }
          else {
            local_170 = *puVar7;
            local_180 = (ulong *)*plVar5;
          }
          local_178 = plVar5[1];
          *plVar5 = (long)puVar7;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          local_1a0 = &local_190;
          if ((char *)local_100._16_8_ == (char *)0x0) {
            local_198 = 0;
            local_190 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,local_100._16_8_,local_a0);
          }
          uVar8 = 0xf;
          if (local_180 != &local_170) {
            uVar8 = local_170;
          }
          if (uVar8 < (ulong)(local_198 + local_178)) {
            uVar8 = 0xf;
            if (local_1a0 != &local_190) {
              uVar8 = CONCAT71(uStack_18f,local_190);
            }
            if (uVar8 < (ulong)(local_198 + local_178)) goto LAB_0033c3a0;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180)
            ;
          }
          else {
LAB_0033c3a0:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_180,(ulong)local_1a0);
          }
          local_120 = &local_110;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_110 = *plVar5;
            uStack_108 = puVar6[3];
          }
          else {
            local_110 = *plVar5;
            local_120 = (long *)*puVar6;
          }
          local_118 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_120);
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110 + 1);
          }
          if (local_1a0 != &local_190) {
            operator_delete(local_1a0,CONCAT71(uStack_18f,local_190) + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170 + 1);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,CONCAT71(uStack_12f,local_130) + 1);
          }
        }
        if (local_48 != (char *)0x0) {
          operator_delete__(local_48);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
      }
    }
    local_100._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_100 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"${CMAKE_CXX_COMPILER}","");
    cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,(string *)local_100);
    std::__cxx11::string::append((char *)&local_1c0);
    cmsys::SystemTools::GetFilenameName(&local_160,(string *)local_100);
    std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_160._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((char *)local_1c0._M_string_length != (char *)0x0) {
      pcVar3 = (char *)0x0;
      do {
        if (local_1c0._M_dataplus._M_p[(long)pcVar3] == '/') {
          local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
        }
        pcVar3 = pcVar3 + 1;
      } while ((char *)local_1c0._M_string_length != pcVar3);
      if ((char *)local_1c0._M_string_length != (char *)0x0) {
        pcVar3 = (char *)0x0;
        do {
          if (local_1c0._M_dataplus._M_p[(long)pcVar3] == '(') {
            local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
          }
          pcVar3 = pcVar3 + 1;
        } while ((char *)local_1c0._M_string_length != pcVar3);
        if ((char *)local_1c0._M_string_length != (char *)0x0) {
          pcVar3 = (char *)0x0;
          do {
            if (local_1c0._M_dataplus._M_p[(long)pcVar3] == ')') {
              local_1c0._M_dataplus._M_p[(long)pcVar3] = '_';
            }
            pcVar3 = pcVar3 + 1;
          } while ((char *)local_1c0._M_string_length != pcVar3);
        }
      }
    }
    cmMakefile::AddCacheDefinition
              ((this->super_cmCommand).Makefile,
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
               "Name of build.",STRING,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_,(ulong)(local_100._16_8_ + 1));
    }
    local_100._16_8_ = local_1c0.field_2._M_allocated_capacity;
    _Var9._M_p = local_1c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p == &local_1c0.field_2) goto LAB_0033c61b;
  }
  operator_delete(_Var9._M_p,(ulong)(local_100._16_8_ + 1));
LAB_0033c61b:
  return name != psVar1;
}

Assistant:

bool cmBuildNameCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if (cacheValue) {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue)) {
      std::string cv = cacheValue;
      std::replace(cv.begin(), cv.end(), '/', '_');
      std::replace(cv.begin(), cv.end(), '(', '_');
      std::replace(cv.begin(), cv.end(), ')', '_');
      this->Makefile->AddCacheDefinition(args[0], cv.c_str(), "Name of build.",
                                         cmStateEnums::STRING);
    }
    return true;
  }

  std::string buildname = "WinNT";
  if (this->Makefile->GetDefinition("UNIX")) {
    buildname = "";
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if (!buildname.empty()) {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg(RegExp.c_str());
      if (reg.find(buildname.c_str())) {
        buildname = reg.match(1) + "-" + reg.match(2);
      }
    }
  }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString(compiler);
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  std::replace(buildname.begin(), buildname.end(), '/', '_');
  std::replace(buildname.begin(), buildname.end(), '(', '_');
  std::replace(buildname.begin(), buildname.end(), ')', '_');

  this->Makefile->AddCacheDefinition(args[0], buildname.c_str(),
                                     "Name of build.", cmStateEnums::STRING);
  return true;
}